

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_tuple_primitive_markDummyValue
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  uVar1 = *arguments;
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    *(byte *)(uVar1 + 8) = *(byte *)(uVar1 + 8) | 0x80;
  }
  return uVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_tuple_primitive_markDummyValue(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    sysbvm_tuple_markDummyValue(arguments[0]);
    return arguments[0];
}